

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-zero-delay-observer.hxx
# Opt level: O2

void __thiscall
stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_0U>::setState
          (ZeroDelayObserver<4U,_3U,_0U> *this,StateVector *x_k,uint k)

{
  size_type sVar1;
  reference this_00;
  
  IndexedMatrix<4U,_1U>::set(&this->x_,x_k,k);
  while( true ) {
    sVar1 = std::
            deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ::size(&this->y_);
    if (sVar1 == 0) {
      return;
    }
    this_00 = std::
              _Deque_iterator<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_&,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_*>
              ::operator[](&(this->y_).
                            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                            ._M_impl.super__Deque_impl_data._M_start,0);
    IndexedMatrix<3U,_1U>::check_(this_00);
    if (k < this_00->k_) break;
    std::
    deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
    ::pop_front(&this->y_);
  }
  return;
}

Assistant:

void ZeroDelayObserver<n,m,p>::setState
(const typename ObserverBase<n,m,p>::StateVector& x_k,unsigned k)
{
    x_.set(x_k,k);
    while (y_.size()>0 && y_[0].getTime()<=k)
    {
        y_.pop_front();
    }

    if (p>0)
        while (u_.size()>0 && u_[0].getTime()<k)
        {
            u_.pop_front();
        }
}